

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::InitGLExtension::exec(InitGLExtension *this,Thread *t)

{
  _func_int **pp_Var1;
  __type _Var2;
  bool bVar3;
  MessageBuilder *pMVar4;
  char *pcVar5;
  NotSupportedError *this_00;
  glEGLImageTargetTexture2DOESFunc p_Var6;
  GLES2Context *pGVar7;
  glEGLImageTargetTexture2DOESFunc local_740;
  MessageBuilder local_738;
  MessageBuilder local_5a8;
  undefined1 local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  int local_3ec;
  string local_3e8 [32];
  string local_3c8 [32];
  undefined1 local_3a8 [8];
  string extension;
  size_type pos;
  allocator<char> local_1e9;
  string local_1e8 [8];
  string extensions;
  MessageBuilder local_1b8;
  byte local_21;
  Thread *pTStack_20;
  bool found;
  EGLThread *thread;
  Thread *t_local;
  InitGLExtension *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  pTStack_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (pTStack_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  local_21 = 0;
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,pTStack_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [36])"Begin -- glGetString(GL_EXTENSIONS)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  pcVar5 = (char *)(**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0xa78))(0x1f03);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,pcVar5,&local_1e9);
  std::allocator<char>::~allocator(&local_1e9);
  tcu::ThreadUtil::Thread::newMessage((MessageBuilder *)&pos,pTStack_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     ((MessageBuilder *)&pos,(char (*) [21])"End -- glGetString()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder((MessageBuilder *)&pos);
  extension.field_2._8_8_ = std::__cxx11::string::find((char *)local_1e8,0x589fc7);
  do {
    std::__cxx11::string::string((string *)local_3a8);
    if (extension.field_2._8_8_ == -1) {
      std::__cxx11::string::operator=((string *)local_3a8,local_1e8);
      std::__cxx11::string::operator=(local_1e8,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_3c8,(ulong)local_1e8);
      std::__cxx11::string::operator=((string *)local_3a8,local_3c8);
      std::__cxx11::string::~string(local_3c8);
      std::__cxx11::string::substr((ulong)local_3e8,(ulong)local_1e8);
      std::__cxx11::string::operator=(local_1e8,local_3e8);
      std::__cxx11::string::~string(local_3e8);
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3a8,&this->m_extension);
    if (_Var2) {
      local_21 = 1;
      local_3ec = 2;
    }
    else {
      extension.field_2._8_8_ = std::__cxx11::string::find((char *)local_1e8,0x589fc7);
      local_3ec = 0;
    }
    std::__cxx11::string::~string((string *)local_3a8);
  } while ((local_3ec == 0) && (extension.field_2._8_8_ != -1));
  if ((local_21 & 1) != 0) {
    bVar3 = std::operator==(&this->m_extension,"GL_OES_EGL_image");
    if (bVar3) {
      tcu::ThreadUtil::Thread::newMessage(&local_5a8,pTStack_20);
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (&local_5a8,
                          (char (*) [59])
                          "Begin -- eglGetProcAddress(\"glEGLImageTargetTexture2DOES\")");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_5a8);
      pp_Var1 = pTStack_20[1].super_Thread._vptr_Thread;
      p_Var6 = (glEGLImageTargetTexture2DOESFunc)
               (**(code **)(*pp_Var1 + 0x110))(pp_Var1,"glEGLImageTargetTexture2DOES");
      pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                         ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)
                          &pTStack_20[1].m_random);
      (pGVar7->glExtensions).imageTargetTexture2D = p_Var6;
      tcu::ThreadUtil::Thread::newMessage(&local_738,pTStack_20);
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_738,(char (*) [9])"End --  ");
      pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->
                         ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)
                          &pTStack_20[1].m_random);
      local_740 = (pGVar7->glExtensions).imageTargetTexture2D;
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&local_740);
      pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (pMVar4,(char (*) [23])" = eglGetProcAddress()");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_738);
    }
    std::__cxx11::string::~string(local_1e8);
    return;
  }
  local_411 = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::operator+(&local_410,&this->m_extension," not supported");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (this_00,pcVar5,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x30b);
  local_411 = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void InitGLExtension::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	// Check extensions
	bool found = false;

	thread.newMessage() << "Begin -- glGetString(GL_EXTENSIONS)" << tcu::ThreadUtil::Message::End;
	std::string extensions = (const char*)thread.gl.getString(GL_EXTENSIONS);
	thread.newMessage() << "End -- glGetString()" << tcu::ThreadUtil::Message::End;

	std::string::size_type pos = extensions.find(" ");

	do
	{
		std::string extension;
		if (pos != std::string::npos)
		{
			extension = extensions.substr(0, pos);
			extensions = extensions.substr(pos+1);
		}
		else
		{
			extension = extensions;
			extensions = "";
		}

		if (extension == m_extension)
		{
			found = true;
			break;
		}
		pos = extensions.find(" ");
	} while (pos != std::string::npos);

	if (!found)
		throw tcu::NotSupportedError((m_extension + " not supported").c_str(), "", __FILE__, __LINE__);


	// Query function pointers
	if (m_extension == "GL_OES_EGL_image")
	{
		thread.newMessage() << "Begin -- eglGetProcAddress(\"glEGLImageTargetTexture2DOES\")" << tcu::ThreadUtil::Message::End;
		thread.runtimeContext->glExtensions.imageTargetTexture2D = (glEGLImageTargetTexture2DOESFunc)thread.egl.getProcAddress("glEGLImageTargetTexture2DOES");
		thread.newMessage() << "End --  " << ((void*)thread.runtimeContext->glExtensions.imageTargetTexture2D) << " = eglGetProcAddress()"<< tcu::ThreadUtil::Message::End;
	}
}